

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

void xmlBufEmpty(xmlBufPtr buf)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  
  if (((buf == (xmlBufPtr)0x0) || (buf->error != 0)) ||
     (pxVar1 = buf->content, pxVar1 == (xmlChar *)0x0)) {
    return;
  }
  uVar3 = (ulong)buf->compat_size;
  if ((uVar3 < 0x7fffffff) && (buf->size != uVar3)) {
    buf->size = uVar3;
  }
  uVar3 = (ulong)buf->compat_use;
  if ((uVar3 < 0x7fffffff) && (buf->use != uVar3)) {
    buf->use = uVar3;
  }
  buf->use = 0;
  if (buf->alloc == XML_BUFFER_ALLOC_IO) {
    pxVar2 = buf->contentIO;
    if (pxVar2 != (xmlChar *)0x0) {
      buf->size = (size_t)(pxVar1 + (buf->size - (long)pxVar2));
      buf->content = pxVar2;
      *pxVar2 = '\0';
      goto LAB_00136393;
    }
  }
  else if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    buf->content = "";
    goto LAB_00136393;
  }
  *pxVar1 = '\0';
LAB_00136393:
  uVar3 = buf->size;
  if (0x7ffffffe < uVar3) {
    uVar3 = 0x7fffffff;
  }
  buf->compat_size = (uint)uVar3;
  uVar3 = 0x7fffffff;
  if (buf->use < 0x7fffffff) {
    uVar3 = buf->use;
  }
  buf->compat_use = (uint)uVar3;
  return;
}

Assistant:

void
xmlBufEmpty(xmlBufPtr buf) {
    if ((buf == NULL) || (buf->error != 0)) return;
    if (buf->content == NULL) return;
    CHECK_COMPAT(buf)
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        buf->content = BAD_CAST "";
    } else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
               (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	buf->size += start_buf;
        buf->content = buf->contentIO;
        buf->content[0] = 0;
    } else {
        buf->content[0] = 0;
    }
    UPDATE_COMPAT(buf)
}